

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O1

void amrex::mlndlap_unimpose_neumann_bc
               (Box *bx,Array4<double> *rhs,Box *nddom,GpuArray<amrex::LinOpBCType,_3U> *lobc,
               GpuArray<amrex::LinOpBCType,_3U> *hibc)

{
  uint uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int i;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 local_d0;
  int local_c8;
  undefined8 local_c0;
  int local_b8;
  undefined8 local_b4;
  int local_ac;
  undefined8 local_a0;
  int local_98;
  IntVect hi;
  IntVect low;
  ulong local_40;
  uint local_38;
  
  auVar4 = _DAT_006979c0;
  auVar3 = _DAT_006979b0;
  uVar1 = (bx->btype).itype;
  lVar10 = 0;
  do {
    if ((lobc->arr[lVar10] == inflow) || (lobc->arr[lVar10] == Neumann)) {
      local_98 = (bx->smallend).vect[2];
      local_a0 = *(undefined8 *)(bx->smallend).vect;
      local_c8 = (bx->bigend).vect[2];
      local_d0 = *(undefined8 *)(bx->bigend).vect;
      *(undefined4 *)((long)&local_d0 + lVar10 * 4) = *(undefined4 *)((long)&local_a0 + lVar10 * 4);
      uVar2 = *(undefined8 *)(bx->smallend).vect;
      local_c0 = uVar2;
      local_b8 = (bx->smallend).vect[2];
      local_ac = local_c8;
      local_b4 = local_d0;
      if ((*(int *)((long)&local_c0 + lVar10 * 4) == (nddom->smallend).vect[lVar10]) &&
         (local_b8 <= local_c8)) {
        local_b4._0_4_ = (int)local_d0;
        local_b4._4_4_ = (int)((ulong)local_d0 >> 0x20);
        local_c0._4_4_ = (int)((ulong)uVar2 >> 0x20);
        local_c0._0_4_ = (int)uVar2;
        uVar6 = (int)local_b4 - (int)local_c0;
        auVar13._4_4_ = 0;
        auVar13._0_4_ = uVar6;
        auVar13._8_4_ = uVar6;
        auVar13._12_4_ = 0;
        auVar13 = auVar13 ^ auVar4;
        do {
          if (local_c0._4_4_ <= local_b4._4_4_) {
            lVar11 = rhs->jstride * 8;
            lVar8 = (long)rhs->p +
                    ((long)local_c0._4_4_ - (long)(rhs->begin).y) * lVar11 +
                    ((long)local_b8 - (long)(rhs->begin).z) * rhs->kstride * 8 +
                    (long)(rhs->begin).x * -8 + (long)(int)local_c0 * 8 + 8;
            lVar9 = (long)local_c0._4_4_;
            do {
              if ((int)local_c0 <= (int)local_b4) {
                uVar7 = 0;
                do {
                  auVar15._8_4_ = (int)uVar7;
                  auVar15._0_8_ = uVar7;
                  auVar15._12_4_ = (int)(uVar7 >> 0x20);
                  auVar15 = (auVar15 | auVar3) ^ auVar4;
                  if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                              auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1))
                  {
                    *(double *)(lVar8 + -8 + uVar7 * 8) = *(double *)(lVar8 + -8 + uVar7 * 8) * 0.5;
                  }
                  if (auVar15._12_4_ <= auVar13._12_4_ &&
                      (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
                    *(double *)(lVar8 + uVar7 * 8) = *(double *)(lVar8 + uVar7 * 8) * 0.5;
                  }
                  uVar7 = uVar7 + 2;
                } while (((ulong)uVar6 + 2 & 0x1fffffffe) != uVar7);
              }
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + lVar11;
            } while (local_b4._4_4_ + 1 != (int)lVar9);
          }
          bVar12 = local_b8 != local_c8;
          local_b8 = local_b8 + 1;
        } while (bVar12);
      }
    }
    if ((hibc->arr[lVar10] == inflow) || (hibc->arr[lVar10] == Neumann)) {
      local_98 = (bx->smallend).vect[2];
      local_a0 = *(undefined8 *)(bx->smallend).vect;
      local_c8 = (bx->bigend).vect[2];
      local_d0 = *(undefined8 *)(bx->bigend).vect;
      local_40 = CONCAT44(uVar1 >> 1,uVar1) & 0x100000001;
      local_38 = uVar1 >> 2 & 1;
      iVar5 = (~*(uint *)((long)&local_40 + lVar10 * 4) & 1) +
              *(int *)((long)&local_d0 + lVar10 * 4);
      *(int *)((long)&local_a0 + lVar10 * 4) = iVar5;
      *(int *)((long)&local_d0 + lVar10 * 4) = iVar5;
      local_c0 = local_a0;
      local_b8 = local_98;
      local_b4 = local_d0;
      local_ac = local_c8;
      if ((*(int *)((long)&local_b4 + lVar10 * 4) == (nddom->bigend).vect[lVar10]) &&
         (local_98 <= local_c8)) {
        local_b4._0_4_ = (int)local_d0;
        local_b4._4_4_ = (int)((ulong)local_d0 >> 0x20);
        local_c0._4_4_ = (int)((ulong)local_a0 >> 0x20);
        local_c0._0_4_ = (int)local_a0;
        uVar6 = (int)local_b4 - (int)local_c0;
        auVar14._4_4_ = 0;
        auVar14._0_4_ = uVar6;
        auVar14._8_4_ = uVar6;
        auVar14._12_4_ = 0;
        auVar14 = auVar14 ^ auVar4;
        do {
          if (local_c0._4_4_ <= local_b4._4_4_) {
            lVar11 = rhs->jstride * 8;
            lVar8 = (long)rhs->p +
                    ((long)local_c0._4_4_ - (long)(rhs->begin).y) * lVar11 +
                    ((long)local_98 - (long)(rhs->begin).z) * rhs->kstride * 8 +
                    (long)(rhs->begin).x * -8 + (long)(int)local_c0 * 8 + 8;
            lVar9 = (long)local_c0._4_4_;
            do {
              if ((int)local_c0 <= (int)local_b4) {
                uVar7 = 0;
                do {
                  auVar16._8_4_ = (int)uVar7;
                  auVar16._0_8_ = uVar7;
                  auVar16._12_4_ = (int)(uVar7 >> 0x20);
                  auVar13 = (auVar16 | auVar3) ^ auVar4;
                  if ((bool)(~(auVar14._4_4_ < auVar13._4_4_ ||
                              auVar14._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar14._4_4_) & 1))
                  {
                    *(double *)(lVar8 + -8 + uVar7 * 8) = *(double *)(lVar8 + -8 + uVar7 * 8) * 0.5;
                  }
                  if (auVar13._12_4_ <= auVar14._12_4_ &&
                      (auVar13._8_4_ <= auVar14._8_4_ || auVar13._12_4_ != auVar14._12_4_)) {
                    *(double *)(lVar8 + uVar7 * 8) = *(double *)(lVar8 + uVar7 * 8) * 0.5;
                  }
                  uVar7 = uVar7 + 2;
                } while (((ulong)uVar6 + 2 & 0x1fffffffe) != uVar7);
              }
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + lVar11;
            } while (local_b4._4_4_ + 1 != (int)lVar9);
          }
          bVar12 = local_98 != local_c8;
          local_98 = local_98 + 1;
        } while (bVar12);
      }
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return;
}

Assistant:

inline void
mlndlap_unimpose_neumann_bc (Box const& bx, Array4<Real> const& rhs, Box const& nddom,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc) noexcept
{
    mlndlap_scale_neumann_bc(0.5, bx, rhs, nddom, lobc, hibc);
}